

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<float> * __thiscall cimg_library::CImg<float>::fill(CImg<float> *this,float *val)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  float *__s;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar16 [16];
  
  auVar8 = _DAT_002540b0;
  auVar7 = _DAT_00254090;
  auVar6 = _DAT_00254080;
  __s = this->_data;
  uVar2 = this->_width;
  uVar3 = this->_height;
  uVar4 = this->_depth;
  uVar5 = this->_spectrum;
  if (uVar5 != 0 && ((uVar4 != 0 && uVar3 != 0) && (uVar2 != 0 && __s != (float *)0x0))) {
    fVar1 = *val;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      lVar12 = (ulong)uVar4 * (ulong)uVar5 * (ulong)uVar3 * (ulong)uVar2;
      if (0 < lVar12) {
        pfVar10 = __s + 1;
        if (__s + 1 < __s + lVar12) {
          pfVar10 = __s + lVar12;
        }
        uVar9 = ~(ulong)__s + (long)pfVar10;
        auVar16._8_4_ = (int)uVar9;
        auVar16._0_8_ = uVar9;
        auVar16._12_4_ = (int)(uVar9 >> 0x20);
        auVar13._0_8_ = uVar9 >> 2;
        auVar13._8_8_ = auVar16._8_8_ >> 2;
        uVar11 = 0;
        auVar13 = auVar13 ^ _DAT_00254090;
        do {
          auVar15._8_4_ = (int)uVar11;
          auVar15._0_8_ = uVar11;
          auVar15._12_4_ = (int)(uVar11 >> 0x20);
          auVar16 = (auVar15 | auVar6) ^ auVar7;
          iVar14 = auVar13._4_4_;
          if ((bool)(~(auVar16._4_4_ == iVar14 && auVar13._0_4_ < auVar16._0_4_ ||
                      iVar14 < auVar16._4_4_) & 1)) {
            __s[uVar11] = fVar1;
          }
          if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
              auVar16._12_4_ <= auVar13._12_4_) {
            __s[uVar11 + 1] = fVar1;
          }
          auVar16 = (auVar15 | auVar8) ^ auVar7;
          iVar17 = auVar16._4_4_;
          if (iVar17 <= iVar14 && (iVar17 != iVar14 || auVar16._0_4_ <= auVar13._0_4_)) {
            __s[uVar11 + 2] = fVar1;
            __s[uVar11 + 3] = fVar1;
          }
          uVar11 = uVar11 + 4;
        } while (((uVar9 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      }
    }
    else {
      memset(__s,0,(ulong)uVar4 * (ulong)uVar5 * (ulong)uVar2 * (ulong)uVar3 * 4);
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T& val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)(ulongT)val,sizeof(T)*size()); // Double cast to allow val to be (void*)
      return *this;
    }